

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
::is_ordered_correctly<std::less<int>>
          (btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>
           *this,field_type i,less<int> *comp)

{
  byte bVar1;
  int iVar2;
  byte local_3e;
  int new_cmp;
  undefined1 auStack_38 [2];
  field_type j;
  bool kCanHaveEquivKeys;
  int cmp;
  anon_class_16_2_3ef9e608 compare;
  less<int> *comp_local;
  field_type i_local;
  btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  new_cmp = -1;
  _auStack_38 = comp;
  compare.comp = (less<int> *)this;
  compare.this = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  *)comp;
  local_3e = btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
             ::start((btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)this);
  do {
    bVar1 = btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::finish((btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)this);
    if (bVar1 <= local_3e) {
      return true;
    }
    if (local_3e == i) {
      if (0 < new_cmp) {
        return false;
      }
    }
    else {
      iVar2 = btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::is_ordered_correctly<std::less<int>_>::anon_class_16_2_3ef9e608::operator()
                        ((anon_class_16_2_3ef9e608 *)auStack_38,local_3e,i);
      if ((iVar2 < new_cmp) || (new_cmp = iVar2, iVar2 == 0)) {
        return false;
      }
    }
    local_3e = local_3e + 1;
  } while( true );
}

Assistant:

bool is_ordered_correctly(field_type i, const Compare &comp) const {
    if (std::is_base_of<BtreeTestOnlyCheckedCompareOptOutBase,
                        Compare>::value ||
        params_type::kIsKeyCompareStringAdapted) {
      return true;
    }

    const auto compare = [&](field_type a, field_type b) {
      const absl::weak_ordering cmp =
          compare_internal::do_three_way_comparison(comp, key(a), key(b));
      return cmp < 0 ? -1 : cmp > 0 ? 1 : 0;
    };
    int cmp = -1;
    constexpr bool kCanHaveEquivKeys =
        params_type::template can_have_multiple_equivalent_keys<key_type>();
    for (field_type j = start(); j < finish(); ++j) {
      if (j == i) {
        if (cmp > 0) return false;
        continue;
      }
      int new_cmp = compare(j, i);
      if (new_cmp < cmp || (!kCanHaveEquivKeys && new_cmp == 0)) return false;
      cmp = new_cmp;
    }
    return true;
  }